

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::
DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint key;
  Entry *pEVar4;
  Entry *pEVar5;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar6;
  Entry *res;
  Entry *pEVar7;
  Exception *this_00;
  Entry *pEVar8;
  ulong uVar9;
  pair<Kernel::SymbolType,_unsigned_int> **pppVar10;
  long lVar11;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> local_58;
  long local_38;
  
  if (0x1c < (long)this->_capacityIndex) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
  lVar11 = (long)iVar1;
  uVar9 = lVar11 * 0x28 + 0xfU & 0xfffffffffffffff0;
  if (uVar9 == 0) {
    pEVar7 = (Entry *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pEVar7 = (Entry *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
    ;
  }
  else if (uVar9 < 0x19) {
    pEVar7 = (Entry *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
    ;
  }
  else if (uVar9 < 0x21) {
    pEVar7 = (Entry *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
  }
  else if (uVar9 < 0x31) {
    pEVar7 = (Entry *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
    ;
  }
  else if (uVar9 < 0x41) {
    pEVar7 = (Entry *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
    ;
  }
  else {
    pEVar7 = (Entry *)::operator_new(uVar9,0x10);
  }
  pEVar4 = this->_entries;
  pEVar5 = this->_afterLast;
  uVar2 = this->_timestamp;
  local_38 = (long)this->_capacity;
  this->_timestamp = 1;
  this->_size = 0;
  this->_deleted = 0;
  iVar3 = this->_capacityIndex;
  this->_capacityIndex = iVar3 + 1;
  this->_capacity = iVar1;
  this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar3 * 4 + 4);
  pEVar8 = pEVar7;
  if (iVar1 != 0) {
    do {
      (pEVar8->field_0)._infoData = 0;
      (pEVar8->_val)._capacity = 0;
      (pEVar8->_val)._stack = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
      (pEVar8->_val)._cursor = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
      (pEVar8->_val)._end = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
      lVar11 = lVar11 + -1;
      pEVar8 = pEVar8 + 1;
    } while (lVar11 != 0);
  }
  this->_entries = pEVar7;
  this->_afterLast = pEVar7 + this->_capacity;
  if (pEVar4 != pEVar5) {
    pppVar10 = &(pEVar4->_val)._end;
    do {
      if ((*(uint *)(pppVar10 + -4) & 1) == 0 && *(uint *)(pppVar10 + -4) >> 2 == uVar2) {
        key = *(uint *)((long)pppVar10 + -0x1c);
        local_58._capacity =
             ((Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)(pppVar10 + -3))->_capacity;
        ((Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)(pppVar10 + -3))->_capacity = 0;
        local_58._cursor = pppVar10[-1];
        local_58._end = *pppVar10;
        pppVar10[-1] = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
        *pppVar10 = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
        local_58._stack = pppVar10[-2];
        pppVar10[-2] = (pair<Kernel::SymbolType,_unsigned_int> *)0x0;
        insert(this,key,&local_58);
        if (local_58._stack != (pair<Kernel::SymbolType,_unsigned_int> *)0x0) {
          uVar9 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar9 == 0) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
          }
          else if (uVar9 < 0x11) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
          }
          else if (uVar9 < 0x19) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
          }
          else if (uVar9 < 0x21) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
          }
          else if (uVar9 < 0x31) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
          }
          else if (uVar9 < 0x41) {
            (local_58._stack)->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
            (local_58._stack)->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
          }
          else {
            operator_delete(local_58._stack,0x10);
          }
        }
      }
      ppVar6 = pppVar10[-2];
      if (ppVar6 != (pair<Kernel::SymbolType,_unsigned_int> *)0x0) {
        uVar9 = ((Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *)(pppVar10 + -3))->_capacity
                * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar9 == 0) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar6;
        }
        else if (uVar9 < 0x11) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar6;
        }
        else if (uVar9 < 0x19) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar6;
        }
        else if (uVar9 < 0x21) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar6;
        }
        else if (uVar9 < 0x31) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar6;
        }
        else if (uVar9 < 0x41) {
          ppVar6->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
          ppVar6->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar6;
        }
        else {
          operator_delete(ppVar6,0x10);
        }
      }
      pEVar7 = (Entry *)(pppVar10 + 1);
      pppVar10 = pppVar10 + 5;
    } while (pEVar7 != pEVar5);
  }
  if (((int)local_38 != 0) && (pEVar4 != (Entry *)0x0)) {
    uVar9 = local_38 * 0x28 + 0xfU & 0xfffffffffffffff0;
    if (uVar9 == 0) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar4;
    }
    else if (uVar9 < 0x11) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar4;
    }
    else if (uVar9 < 0x19) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar4;
    }
    else if (uVar9 < 0x21) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar4;
    }
    else if (uVar9 < 0x31) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar4;
    }
    else if (uVar9 < 0x41) {
      pEVar4->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      pEVar4->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar4;
    }
    else {
      operator_delete(pEVar4,0x10);
    }
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }